

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::LetDeclSymbol::LetDeclSymbol
          (LetDeclSymbol *this,Compilation *compilation,ExpressionSyntax *exprSyntax,
          string_view name,SourceLocation loc)

{
  ExpressionSyntax *local_58;
  SourceLocation local_50;
  SourceLocation local_48;
  char *local_40;
  ExpressionSyntax *local_38;
  ExpressionSyntax *exprSyntax_local;
  Compilation *compilation_local;
  LetDeclSymbol *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  local_40 = name._M_str;
  local_48 = (SourceLocation)name._M_len;
  local_50 = loc;
  local_38 = exprSyntax;
  exprSyntax_local = (ExpressionSyntax *)compilation;
  compilation_local = (Compilation *)this;
  this_local = (LetDeclSymbol *)loc;
  loc_local = local_48;
  Symbol::Symbol(&this->super_Symbol,LetDecl,name,loc);
  Scope::Scope(&this->super_Scope,(Compilation *)exprSyntax_local,&this->super_Symbol);
  nonstd::span_lite::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::
  span<true,_0>(&this->ports);
  local_58 = local_38;
  not_null<slang::syntax::ExpressionSyntax_const*>::
  not_null<slang::syntax::ExpressionSyntax_const*,void>
            ((not_null<slang::syntax::ExpressionSyntax_const*> *)&this->exprSyntax,&local_58);
  return;
}

Assistant:

LetDeclSymbol::LetDeclSymbol(Compilation& compilation, const ExpressionSyntax& exprSyntax,
                             string_view name, SourceLocation loc) :
    Symbol(SymbolKind::LetDecl, name, loc),
    Scope(compilation, this), exprSyntax(&exprSyntax) {
}